

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O2

rect2d * __thiscall rengine::rect2d::operator|=(rect2d *this,vec2 p)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = p.x;
  fVar3 = p.y;
  if (fVar2 < (this->tl).x) {
    (this->tl).x = fVar2;
  }
  if (fVar3 < (this->tl).y) {
    (this->tl).y = fVar3;
  }
  if ((this->br).x <= fVar2 && fVar2 != (this->br).x) {
    (this->br).x = fVar2;
  }
  pfVar1 = &(this->br).y;
  if (*pfVar1 <= fVar3 && fVar3 != *pfVar1) {
    (this->br).y = fVar3;
  }
  return this;
}

Assistant:

rect2d &operator|=(vec2 p) {
        if (p.x < tl.x) tl.x = p.x;
        if (p.y < tl.y) tl.y = p.y;
        if (p.x > br.x) br.x = p.x;
        if (p.y > br.y) br.y = p.y;
        return *this;
    }